

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCase::createInstance
          (BuiltinInputVariationsCase *this,Context *context)

{
  BuiltinInputVariationsCaseInstance *this_00;
  Context *context_local;
  BuiltinInputVariationsCase *this_local;
  
  this_00 = (BuiltinInputVariationsCaseInstance *)operator_new(0x228);
  BuiltinInputVariationsCaseInstance::BuiltinInputVariationsCaseInstance
            (this_00,context,this->m_shaderInputTypes);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* BuiltinInputVariationsCase::createInstance (Context& context) const
{
	return new BuiltinInputVariationsCaseInstance(context, m_shaderInputTypes);
}